

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOW_GEQ_DOM_sub
          (VTimeZone *this,VTZWriter *writer,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,
          int32_t numDays,UDate untilTime,int32_t fromOffset,UErrorCode *status)

{
  ushort uVar1;
  int srcLength;
  int iVar2;
  VTimeZone *this_00;
  UnicodeString dstr;
  UChar local_ba;
  UDate local_b8;
  undefined6 *local_b0;
  undefined1 *local_a0;
  UChar *local_90;
  undefined1 *local_80;
  undefined1 local_70 [64];
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (dayOfMonth < 0 && month != 1) {
    dayOfMonth = dayOfMonth + *(int *)(MONTHLENGTH + (long)month * 4) + 1;
  }
  local_b8 = untilTime;
  beginRRULE(this,writer,month,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  UnicodeString::doAppend(writer->out,(UChar *)ICAL_BYDAY,0,-1);
  local_80 = ICAL_BYDAY;
  local_70._0_2_ = L'=';
  UnicodeString::doAppend(writer->out,(UChar *)local_70,0,1);
  UnicodeString::doAppend(writer->out,(UChar *)(ICAL_DOW_NAMES + (long)(dayOfWeek + -1) * 6),0,-1);
  local_70._0_2_ = L';';
  local_90 = (UChar *)(ICAL_DOW_NAMES + (long)(dayOfWeek + -1) * 6);
  UnicodeString::doAppend(writer->out,(UChar *)local_70,0,1);
  UnicodeString::doAppend(writer->out,(UChar *)ICAL_BYMONTHDAY,0,-1);
  local_a0 = ICAL_BYMONTHDAY;
  local_70._0_2_ = 0x3d;
  UnicodeString::doAppend(writer->out,(UChar *)local_70,0,1);
  local_70._0_8_ = &PTR__UnicodeString_003b5258;
  local_70._8_2_ = 2;
  appendAsciiDigits(dayOfMonth,'\0',(UnicodeString *)local_70);
  iVar2 = local_70._12_4_;
  if (-1 < (short)local_70._8_2_) {
    iVar2 = (int)(short)local_70._8_2_ >> 5;
  }
  UnicodeString::doAppend(writer->out,(UnicodeString *)local_70,0,iVar2);
  if (1 < numDays) {
    iVar2 = numDays + -1;
    do {
      dayOfMonth = dayOfMonth + 1;
      local_ba = L',';
      UnicodeString::doAppend(writer->out,&local_ba,0,1);
      uVar1 = local_70._8_2_ & 1;
      local_70._8_2_ = local_70._8_2_ & 0x1e;
      if (uVar1 != 0) {
        local_70._8_2_ = 2;
      }
      appendAsciiDigits(dayOfMonth,'\0',(UnicodeString *)local_70);
      srcLength = local_70._12_4_;
      if (-1 < (short)local_70._8_2_) {
        srcLength = (int)(short)local_70._8_2_ >> 5;
      }
      UnicodeString::doAppend(writer->out,(UnicodeString *)local_70,0,srcLength);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  if ((local_b8 != 1.838821689216e+17) || (NAN(local_b8))) {
    this_00 = (VTimeZone *)local_70;
    getDateTimeString((double)fromOffset + local_b8,(UnicodeString *)this_00);
    appendUNTIL(this_00,writer,(UnicodeString *)local_70,status);
    if (U_ZERO_ERROR < *status) goto LAB_00207c9b;
  }
  UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
  local_b0 = &ICAL_NEWLINE;
LAB_00207c9b:
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOW_GEQ_DOM_sub(VTZWriter& writer, int32_t month, int32_t dayOfMonth,
                                           int32_t dayOfWeek, int32_t numDays,
                                           UDate untilTime, int32_t fromOffset, UErrorCode& status) const {

    if (U_FAILURE(status)) {
        return;
    }
    int32_t startDayNum = dayOfMonth;
    UBool isFeb = (month == UCAL_FEBRUARY);
    if (dayOfMonth < 0 && !isFeb) {
        // Use positive number if possible
        startDayNum = MONTHLENGTH[month] + dayOfMonth + 1;
    }
    beginRRULE(writer, month, status);
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BYDAY);
    writer.write(EQUALS_SIGN);
    writer.write(ICAL_DOW_NAMES[dayOfWeek - 1]);    // SU, MO, TU...
    writer.write(SEMICOLON);
    writer.write(ICAL_BYMONTHDAY);
    writer.write(EQUALS_SIGN);

    UnicodeString dstr;
    appendAsciiDigits(startDayNum, 0, dstr);
    writer.write(dstr);
    for (int32_t i = 1; i < numDays; i++) {
        writer.write(COMMA);
        dstr.remove();
        appendAsciiDigits(startDayNum + i, 0, dstr);
        writer.write(dstr);
    }

    if (untilTime != MAX_MILLIS) {
        appendUNTIL(writer, getDateTimeString(untilTime + fromOffset, dstr), status);
        if (U_FAILURE(status)) {
            return;
        }
    }
    writer.write(ICAL_NEWLINE);
}